

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::randomize_bernoulli(Tensor *val,real p,real scale)

{
  anon_class_16_2_d80fb611 __gen;
  runtime_error *this;
  long in_RDI;
  anon_class_16_2_d80fb611 b;
  bernoulli_distribution distribution;
  float *in_stack_ffffffffffffff98;
  Dim *in_stack_ffffffffffffffa0;
  bernoulli_distribution *pbVar1;
  real *prVar2;
  
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0xc) == 0) {
    prVar2 = *(real **)(in_RDI + 0x28);
    pbVar1 = *(bernoulli_distribution **)(in_RDI + 0x28);
    Dim::size(in_stack_ffffffffffffffa0);
    __gen.scale = prVar2;
    __gen.distribution = pbVar1;
    std::generate<float*,dynet::TensorTools::randomize_bernoulli(dynet::Tensor&,float,float)::__0>
              ((float *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,__gen);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Bad device type");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::randomize_bernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
  if (val.device->type == DeviceType::CPU) {
    generate(val.v, val.v + val.d.size(), b);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    generate(t, t + val.d.size(), b);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}